

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# status.h
# Opt level: O2

Status * __thiscall leveldb::Status::operator=(Status *this,Status *rhs)

{
  long lVar1;
  char *pcVar2;
  char *state;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pcVar2 = this->state_;
  state = rhs->state_;
  if (pcVar2 != state) {
    if (pcVar2 != (char *)0x0) {
      operator_delete__(pcVar2);
      state = rhs->state_;
    }
    if (state == (char *)0x0) {
      pcVar2 = (char *)0x0;
    }
    else {
      pcVar2 = CopyState(state);
    }
    this->state_ = pcVar2;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return this;
  }
  __stack_chk_fail();
}

Assistant:

inline Status& Status::operator=(const Status& rhs) {
  // The following condition catches both aliasing (when this == &rhs),
  // and the common case where both rhs and *this are ok.
  if (state_ != rhs.state_) {
    delete[] state_;
    state_ = (rhs.state_ == nullptr) ? nullptr : CopyState(rhs.state_);
  }
  return *this;
}